

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathFreeValueTree(xmlNodeSetPtr obj)

{
  xmlNodePtr cur;
  xmlNodePtr *ppxVar1;
  long lVar2;
  
  if (obj != (xmlNodeSetPtr)0x0) {
    ppxVar1 = obj->nodeTab;
    if (ppxVar1 != (xmlNodePtr *)0x0) {
      if (0 < obj->nodeNr) {
        lVar2 = 0;
        do {
          cur = obj->nodeTab[lVar2];
          if (cur != (xmlNodePtr)0x0) {
            if (cur->type == XML_NAMESPACE_DECL) {
              xmlXPathNodeSetFreeNs((xmlNsPtr)cur);
            }
            else {
              xmlFreeNodeList(cur);
            }
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < obj->nodeNr);
        ppxVar1 = obj->nodeTab;
      }
      (*xmlFree)(ppxVar1);
    }
    (*xmlFree)(obj);
    return;
  }
  return;
}

Assistant:

static void
xmlXPathFreeValueTree(xmlNodeSetPtr obj) {
    int i;

    if (obj == NULL) return;

    if (obj->nodeTab != NULL) {
	for (i = 0;i < obj->nodeNr;i++) {
	    if (obj->nodeTab[i] != NULL) {
		if (obj->nodeTab[i]->type == XML_NAMESPACE_DECL) {
		    xmlXPathNodeSetFreeNs((xmlNsPtr) obj->nodeTab[i]);
		} else {
		    xmlFreeNodeList(obj->nodeTab[i]);
		}
	    }
	}
	xmlFree(obj->nodeTab);
    }
    xmlFree(obj);
}